

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_sentinel.cpp
# Opt level: O2

int AF_A_SentinelRefire(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  TObjPtr<AActor> *obj;
  VM_UBYTE VVar1;
  DObject *this;
  bool bVar2;
  int iVar3;
  AActor *pAVar4;
  AActor *self;
  char *__assertion;
  
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0054df3c;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_0054df2c;
  self = *(AActor **)&param->field_0;
  if ((param->field_0).field_1.atag == 1) {
    if (self == (AActor *)0x0) goto LAB_0054de05;
    bVar2 = DObject::IsKindOf((DObject *)self,AActor::RegistrationInfo.MyClass);
    if (!bVar2) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0054df3c;
    }
  }
  else {
    if (self != (AActor *)0x0) goto LAB_0054df2c;
LAB_0054de05:
    self = (AActor *)0x0;
  }
  if (numparam == 1) goto LAB_0054de85;
  VVar1 = param[1].field_0.field_3.Type;
  if (VVar1 != 0xff) {
    if (VVar1 != '\x03') {
LAB_0054df2c:
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_0054df3c;
    }
    this = (DObject *)param[1].field_0.field_1.a;
    if (param[1].field_0.field_1.atag == 1) {
      if ((this != (DObject *)0x0) &&
         (bVar2 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass), !bVar2)) {
        __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_0054df3c;
      }
    }
    else if (this != (DObject *)0x0) goto LAB_0054df2c;
  }
  if ((((uint)numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
     ((VVar1 == '\x03' &&
      ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_0054de85:
    A_FaceTarget(self);
    iVar3 = FRandom::operator()(&pr_sentinelrefire);
    if (iVar3 < 0x1e) {
      return 0;
    }
    obj = &self->target;
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    if ((pAVar4 != (AActor *)0x0) &&
       (pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj), 0 < pAVar4->health)) {
      pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
      bVar2 = P_CheckSight(self,pAVar4,6);
      if (((bVar2) && (bVar2 = P_HitFriend(self), !bVar2)) &&
         (((self->MissileState != (FState *)0x0 || (bVar2 = AActor::CheckMeleeRange(self), bVar2))
          && (iVar3 = FRandom::operator()(&pr_sentinelrefire), 0x27 < iVar3)))) {
        return 0;
      }
    }
    AActor::SetState(self,self->SeeState,false);
    return 0;
  }
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
  ;
LAB_0054df3c:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_strife/a_sentinel.cpp"
                ,0x4e,"int AF_A_SentinelRefire(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SentinelRefire)
{
	PARAM_ACTION_PROLOGUE;

	A_FaceTarget (self);

	if (pr_sentinelrefire() >= 30)
	{
		if (self->target == NULL ||
			self->target->health <= 0 ||
			!P_CheckSight (self, self->target, SF_SEEPASTBLOCKEVERYTHING|SF_SEEPASTSHOOTABLELINES) ||
			P_HitFriend(self) ||
			(self->MissileState == NULL && !self->CheckMeleeRange()) ||
			pr_sentinelrefire() < 40)
		{
			self->SetState (self->SeeState);
		}
	}
	return 0;
}